

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateEnumHeader
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  reference ppEVar2;
  reference ppMVar3;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_38;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_30;
  iterator iter_1;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  local_20;
  iterator iter;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  iter._M_current = (EnumGenerator **)printer;
  local_20._M_current =
       (EnumGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
       ::begin(&this->enum_generators_);
  while( true ) {
    iter_1._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
         ::end(&this->enum_generators_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                        *)&iter_1);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
              ::operator*(&local_20);
    EnumGenerator::GenerateHeader(*ppEVar2,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->nested_message_generators_);
  while( true ) {
    local_38._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::end(&this->nested_message_generators_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              ::operator*(&local_30);
    GenerateEnumHeader(*ppMVar3,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateEnumHeader(io::Printer* printer) {
  for (vector<EnumGenerator*>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateHeader(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateEnumHeader(printer);
  }
}